

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O0

Json __thiscall Client::post(Client *this,string *address,Params *params)

{
  bool bVar1;
  iterator __s;
  Client *this_00;
  Response *pRVar2;
  json_value extraout_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Json JVar3;
  Result result;
  Headers headers;
  Client *in_stack_000001f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  Client *in_stack_fffffffffffffe80;
  Result *this_01;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffe90;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_120 [40];
  string local_f8 [96];
  _Base_ptr local_98;
  string local_90 [32];
  _Base_ptr local_70;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  Client *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  
  __lhs = in_RDI;
  std::chrono::_V2::system_clock::now();
  bVar1 = std::chrono::operator<
                    (in_stack_fffffffffffffe90,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  if (bVar1) {
    requestAccessToken(in_stack_000001f0);
  }
  __a = (allocator<char> *)&stack0xffffffffffffffa8;
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x1b7aeb);
  __s = std::
        multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[13],char_const(&)[17]>
                  ((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (char (*) [13])in_stack_fffffffffffffe80,(char (*) [17])in_stack_fffffffffffffe78
                  );
  local_70 = __s._M_node;
  std::operator+((char *)__lhs,in_RDI);
  local_98 = (_Base_ptr)
             std::
             multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::emplace<char_const(&)[14],std::__cxx11::string>
                       ((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                        (char (*) [14])in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  std::__cxx11::string::~string(local_90);
  waitForRateLimit(in_stack_fffffffffffffe80);
  this_00 = (Client *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s._M_node,__a);
  httplib::Client::Post
            (this_00,in_RSI,(Headers *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
             ,(Params *)in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)(local_120 + 0x27));
  resultChecks(in_stack_ffffffffffffffb0,
               (Result *)
               CONCAT17(in_stack_ffffffffffffffaf,
                        CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
  pRVar2 = httplib::Result::operator->((Result *)0x1b7c2d);
  this_01 = (Result *)local_120;
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::function((function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
              *)this_01,&pRVar2->body);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string>
            (in_stack_ffffffffffffffb8,(parser_callback_t *)in_stack_ffffffffffffffb0,
             (bool)in_stack_ffffffffffffffaf,(bool)in_stack_ffffffffffffffae);
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function((function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
               *)0x1b7c75);
  httplib::Result::~Result(this_01);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x1b7c8f);
  JVar3.m_value.object = extraout_RDX.object;
  JVar3._0_8_ = __lhs;
  return JVar3;
}

Assistant:

Json post(const std::string& address, const httplib::Params& params) {
        if (accessTokenExpiration < Clock::now()) {
            requestAccessToken();
        }

        httplib::Headers headers;
        headers.emplace("Content-Type", "application/json");
        headers.emplace("Authorization", "bearer " + accessToken);

        waitForRateLimit();
        httplib::Result result = apiClient.Post(address.c_str(), headers, params);
        resultChecks(result);

        return Json::parse(std::move(result->body));
    }